

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O1

ClippedEdge *
MutableS2ShapeIndex::ClipVBound(ClippedEdge *edge,int v_end,double v,EdgeAllocator *alloc)

{
  double dVar1;
  double dVar2;
  FaceEdge *pFVar3;
  ClippedEdge *pCVar4;
  double dVar5;
  double dVar6;
  S2LogMessage local_30;
  
  if (v_end == 0) {
    if (v <= (edge->bound).bounds_[1].bounds_.c_[0]) {
      return edge;
    }
  }
  else if ((edge->bound).bounds_[1].bounds_.c_[1] <= v) {
    return edge;
  }
  pFVar3 = edge->face_edge;
  dVar6 = (pFVar3->a).c_[1];
  dVar1 = (pFVar3->b).c_[1];
  if ((dVar6 == dVar1) && (!NAN(dVar6) && !NAN(dVar1))) {
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_clipping.h"
               ,0xab,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_30.stream_,"Check failed: (a) != (b) ",0x19);
    abort();
  }
  dVar2 = (pFVar3->a).c_[0];
  dVar5 = (pFVar3->b).c_[0];
  if (ABS(dVar6 - v) <= ABS(dVar1 - v)) {
    dVar5 = ((v - dVar6) * (dVar5 - dVar2)) / (dVar1 - dVar6) + dVar2;
  }
  else {
    dVar5 = ((v - dVar1) * (dVar2 - dVar5)) / (dVar6 - dVar1) + dVar5;
  }
  dVar6 = R1Interval::Project((edge->bound).bounds_,dVar5);
  pCVar4 = UpdateBound(edge,-(uint)((pFVar3->b).c_[1] < (pFVar3->a).c_[1] !=
                                   (pFVar3->b).c_[0] < (pFVar3->a).c_[0]) & 1 ^ v_end,dVar6,v_end,v,
                       alloc);
  return pCVar4;
}

Assistant:

const MutableS2ShapeIndex::ClippedEdge*
MutableS2ShapeIndex::ClipVBound(const ClippedEdge* edge, int v_end, double v,
                                EdgeAllocator* alloc) {
  // See comments in ClipUBound.
  if (v_end == 0) {
    if (edge->bound[1].lo() >= v) return edge;
  } else {
    if (edge->bound[1].hi() <= v) return edge;
  }
  const FaceEdge& e = *edge->face_edge;
  double u = edge->bound[0].Project(
      S2::InterpolateDouble(v, e.a[1], e.b[1], e.a[0], e.b[0]));
  int u_end = v_end ^ ((e.a[0] > e.b[0]) != (e.a[1] > e.b[1]));
  return UpdateBound(edge, u_end, u, v_end, v, alloc);
}